

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

node_ptr __thiscall
dtc::fdt::device_tree::create_fragment_wrapper(device_tree *this,node_ptr *node,int *fragnum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  node_ptr *pnVar3;
  element_type *peVar4;
  uint uVar5;
  long *plVar6;
  pointer __dest;
  uint uVar7;
  uint *in_RCX;
  __node_base_ptr p_Var8;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  value_type vVar11;
  uint __len;
  size_t __n;
  node_ptr nVar12;
  string propname;
  property_value v;
  node_ptr fragment;
  shared_ptr<dtc::fdt::property> prop;
  string fragment_address;
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  symbols;
  node_ptr wrapper;
  undefined1 local_1b1;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  string local_190;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  void *local_150;
  long lStack_148;
  long local_140;
  value_type local_138;
  node_ptr *local_130;
  undefined1 local_128 [32];
  value_type local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  local_d8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 local_70;
  pointer puStack_68;
  __node_base local_60;
  value_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  bool local_40 [16];
  
  uVar2 = *in_RCX;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00128506;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00128506;
      }
      if (uVar7 < 10000) goto LAB_00128506;
      uVar9 = uVar9 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00128506:
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_130 = (node_ptr *)fragnum;
  std::__cxx11::string::_M_construct((ulong)&local_190,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_190._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x13c71b);
  local_f8._0_8_ = local_e8;
  p_Var8 = (__node_base_ptr)(plVar6 + 2);
  if ((__node_base_ptr)*plVar6 == p_Var8) {
    local_e8._0_8_ = p_Var8->_M_nxt;
    local_e8._8_8_ = plVar6[3];
  }
  else {
    local_e8._0_8_ = p_Var8->_M_nxt;
    local_f8._0_8_ = (__node_base_ptr)*plVar6;
  }
  paVar1 = &local_190.field_2;
  local_f8._8_8_ = plVar6[1];
  *plVar6 = (long)p_Var8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  *in_RCX = *in_RCX + 1;
  local_d8.
  super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  fdt::node::create_special_node((node *)this,&local_190,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"__overlay__","");
  fdt::node::create_special_node((node *)local_c0,&local_190,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_50._8_8_ = 0;
  local_40[0] = false;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_40,local_40);
  local_168 = 0;
  local_160 = 0;
  local_150 = (void *)0x0;
  lStack_148 = 0;
  local_140 = 0;
  local_138 = 6;
  local_170 = &local_160;
  if ((bool *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,CONCAT71(local_40._1_7_,local_40[0]) + 1)
    ;
  }
  pnVar3 = local_130;
  local_1b0 = &local_1a0;
  local_1a8 = (char *)0x0;
  local_1a0 = 0;
  std::__cxx11::string::_M_assign((string *)&local_170);
  if (((pnVar3->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      name_is_path_reference == false) {
    vVar11 = PHANDLE;
    std::__cxx11::string::_M_replace((ulong)&local_1b0,0,local_1a8,0x13c731);
  }
  else {
    vVar11 = STRING;
    std::__cxx11::string::_M_replace((ulong)&local_1b0,0,local_1a8,0x13c738);
  }
  local_138 = vVar11;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_128,local_1b0,local_1a8 + (long)local_1b0);
  local_108.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dtc::fdt::property,std::allocator<dtc::fdt::property>,std::__cxx11::string>
            (&local_108.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(property **)&local_108,(allocator<dtc::fdt::property> *)&local_1b1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  peVar4 = local_108.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0._0_8_ = (_Hash_node_base *)(local_b0 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_190._M_dataplus._M_p,
             local_190._M_dataplus._M_p + local_190._M_string_length);
  local_90._M_p = (pointer)&local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_170,local_170 + local_168);
  local_70 = 0;
  puStack_68 = (pointer)0x0;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  uVar9 = lStack_148 - (long)local_150;
  if (uVar9 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar9 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar9);
  }
  local_60._M_nxt = (_Hash_node_base *)(__dest + uVar9);
  __n = lStack_148 - (long)local_150;
  local_70 = __dest;
  if (__n != 0) {
    puStack_68 = __dest;
    memmove(__dest,local_150,__n);
  }
  puStack_68 = __dest + __n;
  local_58 = local_138;
  std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
            (&peVar4->values,(value_type *)local_b0);
  pnVar3 = local_130;
  if ((void *)local_70 != (void *)0x0) {
    operator_delete((void *)local_70,(long)local_60._M_nxt - local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((_Hash_node_base *)local_b0._0_8_ != (_Hash_node_base *)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_,local_a0._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ::push_back(&local_d8,&local_108);
  fdt::node::create_special_node((node *)local_128,(string *)local_f8,&local_d8);
  fdt::node::merge_node((node *)local_c0._0_8_,pnVar3);
  std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>::
  emplace_back<std::shared_ptr<dtc::fdt::node>>
            ((vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
              *)(local_128._0_8_ + 0xa0),(shared_ptr<dtc::fdt::node> *)local_c0);
  std::vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>::
  emplace_back<std::shared_ptr<dtc::fdt::node>>
            ((vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
              *)(*(long *)this + 0xa0),(shared_ptr<dtc::fdt::node> *)local_128);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  if (local_108.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
  }
  if (local_150 != (void *)0x0) {
    operator_delete(local_150,local_140 - (long)local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  std::
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ::~vector(&local_d8);
  _Var10._M_pi = extraout_RDX;
  if ((__node_base_ptr)local_f8._0_8_ != (__node_base_ptr)local_e8) {
    operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._0_8_ + 1));
    _Var10._M_pi = extraout_RDX_00;
  }
  nVar12.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  nVar12.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (node_ptr)nVar12.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

node_ptr
device_tree::create_fragment_wrapper(node_ptr &node, int &fragnum)
{
	// In a plugin, we can massage these non-/ root nodes into into a fragment
	std::string fragment_address = "fragment@" + std::to_string(fragnum);
	++fragnum;

	std::vector<property_ptr> symbols;

	// Intentionally left empty
	node_ptr newroot = node::create_special_node("", symbols);
	node_ptr wrapper = node::create_special_node("__overlay__", symbols);

	// Generate the fragment with $propname = <&name>
	property_value v;
	std::string propname;
	v.string_data = node->name;
	if (!node->name_is_path_reference)
	{
		propname = "target";
		v.type = property_value::PHANDLE;
	}
	else
	{
		propname = "target-path";
		v.type = property_value::STRING;
	}
	auto prop = std::make_shared<property>(std::string(propname));
	prop->add_value(v);
	symbols.push_back(prop);

	node_ptr fragment = node::create_special_node(fragment_address, symbols);

	wrapper->merge_node(node);
	fragment->add_child(std::move(wrapper));
	newroot->add_child(std::move(fragment));
	return newroot;
}